

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-close-after-read-timeout.c
# Opt level: O2

int run_test_tcp_close_after_read_timeout(void)

{
  int iVar1;
  undefined8 uVar2;
  void *pvVar3;
  char *pcVar4;
  char *pcVar5;
  int64_t eval_b_1;
  int64_t eval_b;
  int64_t eval_b_2;
  sockaddr_in addr;
  uv_tcp_t tcp_server;
  
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,&addr);
  tcp_server.data = (void *)(long)iVar1;
  eval_b = 0;
  if (tcp_server.data == (void *)0x0) {
    uVar2 = uv_default_loop();
    iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,&eval_b);
    tcp_server.data = (void *)(long)iVar1;
    if (tcp_server.data == (void *)0x0) {
      iVar1 = uv_tcp_init(uVar2,&tcp_server);
      eval_b_1 = (int64_t)iVar1;
      eval_b_2 = 0;
      if (eval_b_1 == 0) {
        iVar1 = uv_tcp_bind(&tcp_server,&eval_b,0);
        eval_b_1 = (int64_t)iVar1;
        eval_b_2 = 0;
        if (eval_b_1 == 0) {
          iVar1 = uv_listen(&tcp_server,0x80,on_connection);
          eval_b_1 = (int64_t)iVar1;
          eval_b_2 = 0;
          if (eval_b_1 == 0) {
            uv_unref(&tcp_server);
            iVar1 = uv_tcp_init(uVar2,&client);
            pvVar3 = (void *)(long)iVar1;
            eval_b_1 = 0;
            eval_b = (int64_t)pvVar3;
            if (pvVar3 == (void *)0x0) {
              iVar1 = uv_tcp_connect(&connect_req,&client,&addr,on_client_connect);
              pvVar3 = (void *)(long)iVar1;
              eval_b_1 = 0;
              eval_b = (int64_t)pvVar3;
              if (pvVar3 == (void *)0x0) {
                iVar1 = uv_tcp_init(uVar2,&connection);
                pvVar3 = (void *)(long)iVar1;
                eval_b_1 = 0;
                eval_b = (int64_t)pvVar3;
                if (pvVar3 == (void *)0x0) {
                  iVar1 = uv_timer_init(uVar2,&timer);
                  pvVar3 = (void *)(long)iVar1;
                  eval_b_1 = 0;
                  if (pvVar3 == (void *)0x0) {
                    pvVar3 = (void *)(long)read_cb_called;
                    eval_b_1 = 0;
                    if (pvVar3 == (void *)0x0) {
                      pvVar3 = (void *)(long)on_close_called;
                      eval_b_1 = 0;
                      eval_b = (int64_t)pvVar3;
                      if (pvVar3 == (void *)0x0) {
                        iVar1 = uv_run(uVar2,0);
                        pvVar3 = (void *)(long)iVar1;
                        eval_b_1 = 0;
                        if (pvVar3 == (void *)0x0) {
                          eval_b = 1;
                          eval_b_1 = (int64_t)read_cb_called;
                          if (eval_b_1 == 1) {
                            eval_b = 3;
                            eval_b_1 = (int64_t)on_close_called;
                            if (eval_b_1 == 3) {
                              uv_walk(uVar2,close_walk_cb,0);
                              uv_run(uVar2,0);
                              eval_b = 0;
                              iVar1 = uv_loop_close(uVar2);
                              eval_b_1 = (int64_t)iVar1;
                              if (eval_b == eval_b_1) {
                                uv_library_shutdown();
                                return 0;
                              }
                              pcVar5 = "uv_loop_close(loop)";
                              pcVar4 = "0";
                              uVar2 = 0xb5;
                              pvVar3 = (void *)eval_b;
                            }
                            else {
                              pcVar5 = "on_close_called";
                              pcVar4 = "3";
                              uVar2 = 0xb3;
                              pvVar3 = (void *)eval_b;
                            }
                          }
                          else {
                            pcVar5 = "read_cb_called";
                            pcVar4 = "1";
                            uVar2 = 0xb2;
                            pvVar3 = (void *)eval_b;
                          }
                        }
                        else {
                          pcVar5 = "0";
                          pcVar4 = "r";
                          uVar2 = 0xb0;
                          eval_b = (int64_t)pvVar3;
                        }
                      }
                      else {
                        pcVar5 = "0";
                        pcVar4 = "on_close_called";
                        uVar2 = 0xad;
                      }
                    }
                    else {
                      pcVar5 = "0";
                      pcVar4 = "read_cb_called";
                      uVar2 = 0xac;
                      eval_b = (int64_t)pvVar3;
                    }
                  }
                  else {
                    pcVar5 = "0";
                    pcVar4 = "r";
                    uVar2 = 0xaa;
                    eval_b = (int64_t)pvVar3;
                  }
                }
                else {
                  pcVar5 = "0";
                  pcVar4 = "r";
                  uVar2 = 0xa7;
                }
              }
              else {
                pcVar5 = "0";
                pcVar4 = "r";
                uVar2 = 0xa4;
              }
            }
            else {
              pcVar5 = "0";
              pcVar4 = "r";
              uVar2 = 0x9e;
            }
            goto LAB_00184930;
          }
          uVar2 = 0x87;
        }
        else {
          uVar2 = 0x84;
        }
      }
      else {
        uVar2 = 0x81;
      }
      eval_b_2 = 0;
      pcVar5 = "0";
      pcVar4 = "r";
      pvVar3 = (void *)eval_b_1;
      eval_b_1 = 0;
      goto LAB_00184930;
    }
    uVar2 = 0x7e;
  }
  else {
    uVar2 = 0x96;
  }
  eval_b_1 = 0;
  pcVar5 = "0";
  pcVar4 = "uv_ip4_addr(\"127.0.0.1\", 9123, &addr)";
  pvVar3 = tcp_server.data;
LAB_00184930:
  fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-tcp-close-after-read-timeout.c"
          ,uVar2,pcVar4,"==",pcVar5,pvVar3,"==",eval_b_1);
  abort();
}

Assistant:

TEST_IMPL(tcp_close_after_read_timeout) {
  struct sockaddr_in addr;
  uv_tcp_t tcp_server;
  uv_loop_t* loop;
  int r;

  ASSERT_OK(uv_ip4_addr("127.0.0.1", TEST_PORT, &addr));

  loop = uv_default_loop();

  /* We can't use the echo server, it doesn't handle ECONNRESET. */
  start_server(loop, &tcp_server);

  r = uv_tcp_init(loop, &client);
  ASSERT_OK(r);

  r = uv_tcp_connect(&connect_req,
                     &client,
                     (const struct sockaddr*) &addr,
                     on_client_connect);
  ASSERT_OK(r);

  r = uv_tcp_init(loop, &connection);
  ASSERT_OK(r);

  r = uv_timer_init(loop, &timer);
  ASSERT_OK(r);

  ASSERT_OK(read_cb_called);
  ASSERT_OK(on_close_called);

  r = uv_run(loop, UV_RUN_DEFAULT);
  ASSERT_OK(r);

  ASSERT_EQ(1, read_cb_called);
  ASSERT_EQ(3, on_close_called);

  MAKE_VALGRIND_HAPPY(loop);
  return 0;
}